

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-light.c
# Opt level: O2

_Bool borg_check_light(void)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  borg_grid *pbVar5;
  bool bVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  bool bVar9;
  _Bool _Var10;
  _Bool _Var11;
  wchar_t wVar12;
  wchar_t wVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  byte bVar17;
  long lVar18;
  byte bVar19;
  byte bVar20;
  
  wVar8 = w_x;
  if (((((10 < borg.trait[0x24]) && (borg.trait[0x69] == 0)) || (borg.trait[0x70] != 0)) ||
      ((borg.trait[0x72] != 0 || (borg.trait[0x78] != 0)))) ||
     ((borg.trait[0x73] != 0 || (borg.trait[0x74] != 0)))) {
    return false;
  }
  bVar17 = 0;
  if (borg.trait[0x6c] != 0) {
    return false;
  }
  wVar12 = borg_panel_wid();
  wVar7 = w_y;
  wVar13 = borg_panel_hgt();
  iVar14 = wVar7 / wVar13;
  lVar15 = (long)(wVar8 / wVar12);
  iVar16 = iVar14 + 1;
  bVar20 = borg_detect_door[iVar14][lVar15] ^ 1;
  if ((borg_detect_door[iVar14][lVar15 + 1] & 1U) == 0) {
    bVar20 = 1;
  }
  if ((borg_detect_door[iVar16][lVar15 + 1] & borg_detect_door[iVar16][lVar15]) == 0) {
    bVar20 = 1;
  }
  bVar19 = borg_detect_evil[iVar14][lVar15] ^ 1;
  if ((borg_detect_evil[iVar14][lVar15 + 1] & 1U) == 0) {
    bVar19 = 1;
  }
  if ((borg_detect_evil[iVar16][lVar15 + 1] & borg_detect_evil[iVar16][lVar15]) == 0) {
    bVar19 = 1;
  }
  _Var11 = borg_detect_obj[iVar14][lVar15];
  _Var1 = borg_detect_obj[iVar16][lVar15];
  _Var2 = borg_detect_obj[iVar16][lVar15 + 1];
  _Var3 = borg_detect_obj[iVar14][lVar15 + 1];
  if (borg.trait[0x25] != 0) {
    bVar19 = 0;
  }
  iVar4 = borg.trait[0x69];
  if (iVar4 == 0) {
    bVar20 = 0;
LAB_0021f466:
    bVar6 = false;
    bVar9 = false;
    if ((bVar19 & 1) != 0) goto LAB_0021f472;
LAB_0021f564:
    if ((((bVar19 & 1) != 0) &&
        ((borg.when_detect_evil == 0 || (0x13 < (int)borg_t - (int)borg.when_detect_evil)))) &&
       (((_Var10 = borg_spell_fail(DETECT_EVIL,L'('), _Var10 ||
         ((_Var10 = borg_spell_fail(DETECT_MONSTERS,L'('), _Var10 ||
          (_Var10 = borg_spell_fail(READ_MINDS,L'('), _Var10)))) ||
        (_Var10 = borg_spell_fail(SEEK_BATTLE,L'('), _Var10)))) {
      borg_note("# Checking for monsters.");
      borg_react("SELF:evil","SELF:evil");
      borg.when_detect_evil = borg_t;
      return true;
    }
    if ((bVar6) || (bVar20 != 0)) {
      if ((((borg.when_detect_traps != 0) &&
           (((int)borg_t - (int)borg.when_detect_doors < 5 &&
            (int)borg_t - (int)borg.when_detect_traps < 5) && borg.when_detect_doors != 0)) ||
          (borg.trait[0x69] == 0)) ||
         ((((_Var10 = borg_activate_item(act_detect_all), !_Var10 &&
            (_Var10 = borg_activate_item(act_mapping), !_Var10)) &&
           (_Var10 = borg_spell_fail(DETECTION,L'('), !_Var10)) &&
          ((_Var10 = borg_spell_fail(FIND_TRAPS_DOORS_STAIRS,L'('), !_Var10 &&
           (_Var10 = borg_spell_fail(DETECT_STAIRS,L'('), !_Var10)))))) {
        if (((bVar6) &&
            ((borg.when_detect_traps == 0 || (6 < (int)borg_t - (int)borg.when_detect_traps)))) &&
           ((borg.trait[0x69] != 0 &&
            ((_Var10 = borg_spell_fail(DETECTION,L'('), _Var10 ||
             (_Var10 = borg_spell_fail(FIND_TRAPS_DOORS_STAIRS,L'('), _Var10)))))) {
          borg_note("# Checking for traps.");
          borg_react("SELF:trap","SELF:trap");
          borg.when_detect_traps = borg_t;
          return true;
        }
        goto LAB_0021f749;
      }
      borg_note("# Checking for traps, doors & stairs.");
      borg_react("SELF:both","SELF:both");
      borg.when_detect_traps = borg_t;
    }
    else {
LAB_0021f749:
      if (((bVar20 == 0) ||
          (((borg.when_detect_doors != 0 && ((int)borg_t - (int)borg.when_detect_doors < 9)) ||
           (borg.trait[0x69] == 0)))) ||
         ((((_Var10 = borg_activate_item(act_detect_all), !_Var10 &&
            (_Var10 = borg_activate_item(act_mapping), !_Var10)) &&
           (_Var10 = borg_spell_fail(DETECTION,L'('), !_Var10)) &&
          (_Var10 = borg_spell_fail(FIND_TRAPS_DOORS_STAIRS,L'('), !_Var10)))) {
        if ((((bVar17 != 0) &&
             ((borg.when_detect_walls == 0 || (0xe < (int)borg_t - (int)borg.when_detect_walls))))
            && (borg.trait[0x69] != 0)) &&
           ((((_Var10 = borg_activate_item(act_mapping), _Var10 ||
              (_Var10 = borg_read_scroll(sv_scroll_mapping), _Var10)) ||
             (_Var10 = borg_use_staff(sv_staff_mapping), _Var10)) ||
            ((_Var10 = borg_zap_rod(sv_rod_mapping), _Var10 ||
             (_Var10 = borg_spell(SENSE_SURROUNDINGS), _Var10)))))) {
          borg_note("# Checking for walls.");
          borg_react("SELF:wall","SELF:wall");
          borg.when_detect_walls = borg_t;
          for (lVar15 = 0; lVar15 != 0x42; lVar15 = lVar15 + 1) {
            pbVar5 = borg_grids[lVar15];
            for (lVar18 = 2; lVar18 != 0x94a; lVar18 = lVar18 + 0xc) {
              (&pbVar5->field_0x1)[lVar18] = (&pbVar5->field_0x1)[lVar18] & 0xfe;
            }
          }
          return true;
        }
        if ((((byte)(_Var1 & _Var2 & _Var3 & _Var11) != 0) ||
            ((borg.when_detect_obj != 0 && ((int)borg_t - (int)borg.when_detect_obj < 0x14)))) ||
           ((_Var11 = borg_activate_item(act_detect_objects), !_Var11 &&
            (_Var11 = borg_spell_fail(OBJECT_DETECTION,L'('), !_Var11)))) {
          _Var11 = borg_check_light_only();
          return _Var11;
        }
        borg_note("# Checking for objects.");
        borg_react("SELF:obj","SELF:obj");
        goto LAB_0021f55a;
      }
      borg_note("# Checking for doors.");
      borg_react("SELF:door","SELF:door");
    }
    borg.when_detect_doors = borg_t;
  }
  else {
    bVar17 = borg_detect_wall[iVar14][lVar15] & borg_detect_wall[iVar14][lVar15 + 1] &
             borg_detect_wall[iVar16][lVar15] & borg_detect_wall[iVar16][lVar15 + 1] ^ 1;
    bVar9 = true;
    if (((borg_detect_trap[iVar16][lVar15 + 1] == true) &&
        (borg_detect_trap[iVar16][lVar15] != false)) &&
       ((borg_detect_trap[iVar14][lVar15 + 1] != false &&
        (borg_detect_trap[iVar14][lVar15] != false)))) {
      if (bVar20 == 0) goto LAB_0021f466;
      bVar9 = false;
    }
LAB_0021f472:
    bVar6 = bVar9;
    if ((borg.when_detect_traps == 0) ||
       (iVar14 = (int)borg_t, borg.when_detect_evil == 0 || 4 < iVar14 - borg.when_detect_traps)) {
      if (iVar4 != 0) goto LAB_0021f4e1;
      goto LAB_0021f564;
    }
    if ((iVar4 == 0) ||
       (iVar14 - borg.when_detect_evil < 5 &&
        (iVar14 - borg.when_detect_doors < 5 && borg.when_detect_doors != 0))) goto LAB_0021f564;
LAB_0021f4e1:
    _Var10 = borg_activate_item(act_detect_all);
    if ((!_Var10) &&
       (((_Var10 = borg_activate_item(act_mapping), !_Var10 &&
         (_Var10 = borg_zap_rod(sv_rod_detection), !_Var10)) &&
        (_Var10 = borg_spell_fail(SENSE_SURROUNDINGS,L'('), !_Var10)))) goto LAB_0021f564;
    borg_note("# Checking for traps, doors, and evil.");
    borg_react("SELF:TDE","SELF:TDE");
    borg.when_detect_traps = borg_t;
    borg.when_detect_doors = borg_t;
    borg.when_detect_evil = borg_t;
LAB_0021f55a:
    borg.when_detect_obj = borg_t;
  }
  return true;
}

Assistant:

bool borg_check_light(void)
{
    int q_x, q_y;

    bool do_trap;
    bool do_door;
    bool do_wall;
    bool do_evil;
    bool do_obj;

    /* Never in town when mature (scary guy)*/
    if (borg.trait[BI_MAXCLEVEL] > 10 && !borg.trait[BI_CDEPTH])
        return false;

    /* Never when compromised, save your mana */
    if (borg.trait[BI_ISBLIND] 
        || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISIMAGE] 
        || borg.trait[BI_ISPOISONED]
        || borg.trait[BI_ISCUT] 
        || borg.trait[BI_ISWEAK])
        return false;

    /* XXX XXX XXX Dark */

    /* Extract the panel */
    q_x = w_x / borg_panel_wid();
    q_y = w_y / borg_panel_hgt();

    /* Start */
    do_trap = false;

    /* Determine if we need to detect traps */
    if (!borg_detect_trap[q_y + 0][q_x + 0])
        do_trap = true;
    if (!borg_detect_trap[q_y + 0][q_x + 1])
        do_trap = true;
    if (!borg_detect_trap[q_y + 1][q_x + 0])
        do_trap = true;
    if (!borg_detect_trap[q_y + 1][q_x + 1])
        do_trap = true;

    /* Hack -- check traps every few turns anyway */
    /* if (!when_detect_traps || (borg_t - when_detect_traps >= 183)) do_trap =
     * true; */

    /* Start */
    do_door = false;

    /* Determine if we need to detect doors */
    if (!borg_detect_door[q_y + 0][q_x + 0])
        do_door = true;
    if (!borg_detect_door[q_y + 0][q_x + 1])
        do_door = true;
    if (!borg_detect_door[q_y + 1][q_x + 0])
        do_door = true;
    if (!borg_detect_door[q_y + 1][q_x + 1])
        do_door = true;

    /* Hack -- check doors every few turns anyway */
    /* if (!when_detect_doors || (borg_t - when_detect_doors >= 731)) do_door =
     * true; */

    /* Start */
    do_wall = false;

    /* Determine if we need to detect walls */
    if (!borg_detect_wall[q_y + 0][q_x + 0])
        do_wall = true;
    if (!borg_detect_wall[q_y + 0][q_x + 1])
        do_wall = true;
    if (!borg_detect_wall[q_y + 1][q_x + 0])
        do_wall = true;
    if (!borg_detect_wall[q_y + 1][q_x + 1])
        do_wall = true;

    /* Hack -- check walls every few turns anyway */
    /* if (!when_detect_walls || (borg_t - when_detect_walls >= 937)) do_wall =
     * true; */

    /* Start */
    do_evil = false;

    /* Determine if we need to detect evil */
    if (!borg_detect_evil[q_y + 0][q_x + 0])
        do_evil = true;
    if (!borg_detect_evil[q_y + 0][q_x + 1])
        do_evil = true;
    if (!borg_detect_evil[q_y + 1][q_x + 0])
        do_evil = true;
    if (!borg_detect_evil[q_y + 1][q_x + 1])
        do_evil = true;

    /* Start */
    do_obj = false;

    /* Determine if we need to detect evil */
    if (!borg_detect_obj[q_y + 0][q_x + 0])
        do_obj = true;
    if (!borg_detect_obj[q_y + 0][q_x + 1])
        do_obj = true;
    if (!borg_detect_obj[q_y + 1][q_x + 0])
        do_obj = true;
    if (!borg_detect_obj[q_y + 1][q_x + 1])
        do_obj = true;

    /* Hack -- check evil every few turns anyway- more fq if low level */
    /* if (!when_detect_evil ||
       (borg_t - when_detect_evil  >= 183 - (80 - borg.trait[BI_MAXCLEVEL])))
       do_evil = true; */

    /* Really low level */
    /* if (borg.trait[BI_CLEVEL] <= 3 &&
        (!when_detect_evil ||
        (borg_t - when_detect_evil  >= 50))) do_evil = true; */

    /* Not too frequent in town */
    /* if (borg.trait[BI_CDEPTH] == 0 &&
        (!when_detect_evil ||
        (borg_t - when_detect_evil  >= 250))) do_evil = true; */

    /* Dont bother if I have ESP */
    if (borg.trait[BI_ESP])
        do_evil = false;

    /* Only look for monsters in town, not walls, etc (scary guy)*/
    if (!borg.trait[BI_CDEPTH]) {
        do_trap = false;
        do_door = false;
        do_wall = false;
    }

    /*** Do Things ***/

    /* Hack -- find traps and doors and evil*/
    if ((do_trap || do_door || do_evil)
        && ((!borg.when_detect_traps || (borg_t - borg.when_detect_traps >= 5))
            || (!borg.when_detect_evil || (borg_t - borg.when_detect_evil >= 5))
            || (!borg.when_detect_doors
                || (borg_t - borg.when_detect_doors >= 5)))
        && borg.trait[BI_CDEPTH]) /* Never in town */
    {

        /* Check for traps and doors and evil*/
        if (borg_activate_item(act_detect_all)
            || borg_activate_item(act_mapping) 
            || borg_zap_rod(sv_rod_detection)
            || borg_spell_fail(SENSE_SURROUNDINGS, 40)) {
            borg_note("# Checking for traps, doors, and evil.");

            borg_react("SELF:TDE", "SELF:TDE");

            borg.when_detect_traps = borg_t;
            borg.when_detect_doors = borg_t;
            borg.when_detect_evil  = borg_t;
            borg.when_detect_obj   = borg_t;

            return true;
        }
    }

    /* Hack -- find evil */
    if (do_evil
        && (!borg.when_detect_evil || (borg_t - borg.when_detect_evil >= 20))) {
        /* Check for evil */
        if (borg_spell_fail(DETECT_EVIL, 40)
            || borg_spell_fail(DETECT_MONSTERS, 40)
            || borg_spell_fail(READ_MINDS, 40)
            || borg_spell_fail(SEEK_BATTLE, 40)) {
            borg_note("# Checking for monsters.");

            borg_react("SELF:evil", "SELF:evil");

            borg.when_detect_evil = borg_t;

            return true;
        }
    }

    /* Hack -- find traps and doors (and stairs) */
    if ((do_trap || do_door)
        && ((!borg.when_detect_traps || (borg_t - borg.when_detect_traps >= 5))
            || (!borg.when_detect_doors
                || (borg_t - borg.when_detect_doors >= 5)))
        && borg.trait[BI_CDEPTH]) /* Never in town */
    {
        /* Check for traps and doors */
        if (borg_activate_item(act_detect_all)
            || borg_activate_item(act_mapping) 
            || borg_spell_fail(DETECTION, 40)
            || borg_spell_fail(FIND_TRAPS_DOORS_STAIRS, 40)
            || borg_spell_fail(DETECT_STAIRS, 40)) {
            borg_note("# Checking for traps, doors & stairs.");

            borg_react("SELF:both", "SELF:both");

            borg.when_detect_traps = borg_t;
            borg.when_detect_doors = borg_t;

            return true;
        }
    }

    /* Hack -- find traps */
    if (do_trap
        && (!borg.when_detect_traps || (borg_t - borg.when_detect_traps >= 7))
        && borg.trait[BI_CDEPTH]) /* Never in town */
    {
        /* Check for traps */
        if (borg_spell_fail(DETECTION, 40)
            || borg_spell_fail(FIND_TRAPS_DOORS_STAIRS, 40)) {
            borg_note("# Checking for traps.");

            borg_react("SELF:trap", "SELF:trap");

            borg.when_detect_traps = borg_t;

            return true;
        }
    }

    /* Hack -- find doors */
    if (do_door
        && (!borg.when_detect_doors || (borg_t - borg.when_detect_doors >= 9))
        && borg.trait[BI_CDEPTH]) /* Never in town */
    {
        /* Check for traps */
        if (borg_activate_item(act_detect_all)
            || borg_activate_item(act_mapping) || borg_spell_fail(DETECTION, 40)
            || borg_spell_fail(FIND_TRAPS_DOORS_STAIRS, 40)) {
            borg_note("# Checking for doors.");

            borg_react("SELF:door", "SELF:door");

            borg.when_detect_doors = borg_t;

            return true;
        }
    }

    /* Hack -- find walls */
    if (do_wall
        && (!borg.when_detect_walls || (borg_t - borg.when_detect_walls >= 15))
        /* Never in town */
        && borg.trait[BI_CDEPTH]) {
        /* Check for walls */
        if (borg_activate_item(act_mapping)
            || borg_read_scroll(sv_scroll_mapping)
            || borg_use_staff(sv_staff_mapping) || borg_zap_rod(sv_rod_mapping)
            || borg_spell(SENSE_SURROUNDINGS)) {
            int y, x;

            borg_note("# Checking for walls.");

            borg_react("SELF:wall", "SELF:wall");

            borg.when_detect_walls = borg_t;

            /*
             * Clear the BORG_IGNORE_MAP flag:  immediately after detection
             * want to use the map's information rather than what the borg
             * remembers.
             */
            for (y = 0; y < AUTO_MAX_Y; ++y) {
                for (x = 0; x < AUTO_MAX_X; ++x) {
                    borg_grids[y][x].info &= ~BORG_IGNORE_MAP;
                }
            }
            return true;
        }
    }

    /* Hack -- find objects */
    if (do_obj
        && (!borg.when_detect_obj || (borg_t - borg.when_detect_obj >= 20))) {
        /* Check for objects */
        if (borg_activate_item(act_detect_objects)
            || borg_spell_fail(OBJECT_DETECTION, 40)) {
            borg_note("# Checking for objects.");

            borg_react("SELF:obj", "SELF:obj");

            borg.when_detect_obj = borg_t;

            return true;
        }
    }

    /* Do the actual illumination bit */
    return borg_check_light_only();
}